

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedFixedWingAircraft.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::GED_EnhancedFixedWingAircraft::operator==
          (GED_EnhancedFixedWingAircraft *this,GED_EnhancedFixedWingAircraft *Value)

{
  KBOOL KVar1;
  GED_EnhancedFixedWingAircraft *Value_local;
  GED_EnhancedFixedWingAircraft *this_local;
  
  KVar1 = GED_BasicFixedWingAircraft::operator!=
                    (&this->super_GED_BasicFixedWingAircraft,
                     &Value->super_GED_BasicFixedWingAircraft);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if (this->m_ui8SupFuelStatus == Value->m_ui8SupFuelStatus) {
    if (this->m_ui8AirMaintStatus == Value->m_ui8AirMaintStatus) {
      if (this->m_ui8PriAmmun == Value->m_ui8PriAmmun) {
        if (this->m_ui8SecAmmun == Value->m_ui8SecAmmun) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL GED_EnhancedFixedWingAircraft::operator == ( const GED_EnhancedFixedWingAircraft & Value ) const
{
    if( GED_BasicFixedWingAircraft::operator!=( Value ) )   return false;
    if( m_ui8SupFuelStatus  != Value.m_ui8SupFuelStatus )   return false;
    if( m_ui8AirMaintStatus != Value.m_ui8AirMaintStatus )  return false;
    if( m_ui8PriAmmun       != Value.m_ui8PriAmmun )        return false;
    if( m_ui8SecAmmun       != Value.m_ui8SecAmmun )        return false;
    return true;
}